

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llog_message.cpp
# Opt level: O2

void __thiscall ins::LLogMessage::~LLogMessage(LLogMessage *this)

{
  LLog *this_00;
  string local_30;
  
  std::operator<<((ostream *)this,'\n');
  this_00 = LLog::Instance();
  std::__cxx11::stringbuf::str();
  LLog::operator<<(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (this->fatal_ != true) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    return;
  }
  exit(1);
}

Assistant:

LLogMessage::~LLogMessage() {
  oss_ << '\n';
  LLog::Instance() << oss_.str();
  if (fatal_) {
#if _WIN32
    system("pause");
#endif // _WIN32
    exit(EXIT_FAILURE);
  }
}